

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.h
# Opt level: O0

NRooks * __thiscall pm::World::createSampler<pm::NRooks,unsigned_int_const&>(World *this,uint *args)

{
  reference this_00;
  pointer pSVar1;
  unique_ptr<pm::NRooks,_std::default_delete<pm::NRooks>_> local_28;
  unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_> local_20;
  uint *local_18;
  uint *args_local;
  World *this_local;
  
  local_18 = args;
  args_local = (uint *)this;
  std::make_unique<pm::NRooks,unsigned_int_const&>((uint *)&local_28);
  std::unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>>::
  unique_ptr<pm::NRooks,std::default_delete<pm::NRooks>,void>
            ((unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>> *)&local_20,&local_28);
  std::
  vector<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
  ::push_back(&this->samplers_,(value_type *)&local_20);
  std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>::~unique_ptr(&local_20);
  std::unique_ptr<pm::NRooks,_std::default_delete<pm::NRooks>_>::~unique_ptr(&local_28);
  this_00 = std::
            vector<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
            ::back(&this->samplers_);
  pSVar1 = std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>::get(this_00);
  return (NRooks *)pSVar1;
}

Assistant:

T *World::createSampler(Args &&... args)
{
	samplers_.push_back(std::make_unique<T>(std::forward<Args>(args)...));
	return static_cast<T *>(samplers_.back().get());
}